

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  size_t length,semantic_tag param_3,ser_context *param_4,error_code *ec)

{
  int iVar1;
  uint uVar2;
  unsigned_long *in_RDI;
  binary_stream_sink *in_R8;
  size_t in_stack_00000048;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000050;
  ubjson_errc in_stack_ffffffffffffffcc;
  uint8_t ch;
  
  uVar2 = (int)in_RDI[0xf] + 1;
  *(uint *)(in_RDI + 0xf) = uVar2;
  iVar1 = ubjson_options_common::max_nesting_depth
                    ((ubjson_options_common *)((long)in_RDI + *(long *)(in_RDI[8] - 0x18) + 0x40));
  if (iVar1 < (int)uVar2) {
    std::error_code::operator=((error_code *)in_R8,in_stack_ffffffffffffffcc);
  }
  else {
    ch = '\0';
    std::
    vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::ubjson::ubjson_container_type,unsigned_long&>
              ((vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                *)in_R8,(ubjson_container_type *)(ulong)uVar2,in_RDI);
    binary_stream_sink::push_back(in_R8,ch);
    binary_stream_sink::push_back(in_R8,ch);
    put_length(in_stack_00000050,in_stack_00000048);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(ubjson_container_type::object, length);
        sink_.push_back(jsoncons::ubjson::ubjson_type::start_object_marker);
        sink_.push_back(jsoncons::ubjson::ubjson_type::count_marker);
        put_length(length);

        JSONCONS_VISITOR_RETURN;
    }